

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<int,_int>,_Eigen::internal::redux_evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *mat,
            scalar_sum_op<int,_int> *func)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  piVar2 = (mat->m_evaluator).
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>.m_data;
  uVar3 = (mat->m_xpr->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  uVar6 = uVar3;
  uVar5 = uVar3;
  if ((long)uVar3 < 0) {
    uVar6 = uVar3 + 3;
    uVar5 = uVar3 + 7;
  }
  if (uVar3 + 3 < 7) {
    iVar4 = *piVar2;
    if (1 < (long)uVar3) {
      uVar5 = 1;
      do {
        iVar4 = iVar4 + piVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    iVar4 = *piVar2;
    iVar8 = piVar2[1];
    iVar9 = piVar2[2];
    iVar10 = piVar2[3];
    if (7 < (long)uVar3) {
      uVar5 = uVar5 & 0xfffffffffffffff8;
      iVar11 = piVar2[4];
      iVar12 = piVar2[5];
      iVar13 = piVar2[6];
      iVar14 = piVar2[7];
      if (0xf < (long)uVar3) {
        lVar7 = 8;
        do {
          piVar1 = piVar2 + lVar7;
          iVar4 = iVar4 + *piVar1;
          iVar8 = iVar8 + piVar1[1];
          iVar9 = iVar9 + piVar1[2];
          iVar10 = iVar10 + piVar1[3];
          piVar1 = piVar2 + lVar7 + 4;
          iVar11 = iVar11 + *piVar1;
          iVar12 = iVar12 + piVar1[1];
          iVar13 = iVar13 + piVar1[2];
          iVar14 = iVar14 + piVar1[3];
          lVar7 = lVar7 + 8;
        } while (lVar7 < (long)uVar5);
      }
      iVar4 = iVar11 + iVar4;
      iVar8 = iVar12 + iVar8;
      iVar9 = iVar13 + iVar9;
      iVar10 = iVar14 + iVar10;
      if ((long)uVar5 < (long)uVar6) {
        piVar1 = piVar2 + uVar5;
        iVar4 = iVar4 + *piVar1;
        iVar8 = iVar8 + piVar1[1];
        iVar9 = iVar9 + piVar1[2];
        iVar10 = iVar10 + piVar1[3];
      }
    }
    iVar4 = iVar10 + iVar8 + iVar9 + iVar4;
    if ((long)uVar6 < (long)uVar3) {
      do {
        iVar4 = iVar4 + piVar2[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  return iVar4;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }